

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_GiveToSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  char *__assertion;
  VMReturn *in_R9;
  AActor *pAVar8;
  bool bVar9;
  TThinkerIterator<AActor> it;
  int in_stack_ffffffffffffffa8;
  FThinkerIterator local_48;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d1254;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d1244:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d1254:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x998,
                  "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar8 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar8 != (AActor *)0x0) {
      pPVar4 = (pAVar8->super_DThinker).super_DObject.Class;
      if (pPVar4 == (PClass *)0x0) {
        iVar2 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
        pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
        (pAVar8->super_DThinker).super_DObject.Class = pPVar4;
      }
      bVar9 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar1 && bVar9) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar9 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar1) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (!bVar9) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003d1254;
      }
      goto LAB_003d1132;
    }
  }
  else if (pAVar8 != (AActor *)0x0) goto LAB_003d1244;
  pAVar8 = (AActor *)0x0;
LAB_003d1132:
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  pAVar5 = (pAVar8->master).field_0.p;
  iVar2 = 0;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      iVar2 = 0;
      pAVar5 = (AActor *)FThinkerIterator::Next(&local_48,false);
      if (pAVar5 != (AActor *)0x0) {
        iVar2 = 0;
        do {
          pAVar6 = (pAVar8->master).field_0.p;
          if (pAVar6 == (AActor *)0x0) {
LAB_003d11a5:
            pAVar6 = (AActor *)0x0;
          }
          else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar8->master).field_0.p = (AActor *)0x0;
            goto LAB_003d11a5;
          }
          pAVar7 = (pAVar5->master).field_0.p;
          if (pAVar7 == (AActor *)0x0) {
LAB_003d11c4:
            pAVar7 = (AActor *)0x0;
          }
          else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar5->master).field_0.p = (AActor *)0x0;
            goto LAB_003d11c4;
          }
          if (pAVar5 != pAVar8 && pAVar7 == pAVar6) {
            bVar9 = DoGiveInventory(pAVar5,true,param,
                                    (TArray<VMValue,_VMValue> *)defaultparam->Array,numparam,in_R9,
                                    in_stack_ffffffffffffffa8);
            iVar2 = iVar2 + (uint)bVar9;
          }
          pAVar5 = (AActor *)FThinkerIterator::Next(&local_48,false);
        } while (pAVar5 != (AActor *)0x0);
      }
    }
    else {
      (pAVar8->master).field_0.p = (AActor *)0x0;
    }
  }
  iVar3 = 0;
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9a8,
                    "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(int *)ret->Location = iVar2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	if (self->master != NULL)
	{
		while ((mo = it.Next()))
		{
			if (mo->master == self->master && mo != self)
			{
				count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
			}
		}
	}
	ACTION_RETURN_INT(count);
}